

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Output::flowKey(Output *this,StringRef Key)

{
  StringRef s;
  reference pIVar1;
  StringRef local_88;
  Output *local_78;
  char *local_70;
  StringRef local_68;
  StringRef local_58;
  int local_44;
  undefined1 auStack_40 [4];
  int I;
  StringRef local_30;
  Output *local_20;
  Output *this_local;
  StringRef Key_local;
  
  Key_local.Data = (char *)Key.Length;
  this_local = (Output *)Key.Data;
  local_20 = this;
  pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                     ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                      &this->StateStack);
  if (*pIVar1 == inFlowMapOtherKey) {
    StringRef::StringRef(&local_30,", ");
    output(this,local_30);
  }
  if ((this->WrapColumn != 0) && (this->WrapColumn < this->Column)) {
    StringRef::StringRef((StringRef *)auStack_40,"\n");
    output(this,_auStack_40);
    for (local_44 = 0; local_44 < this->ColumnAtMapFlowStart; local_44 = local_44 + 1) {
      StringRef::StringRef(&local_58," ");
      output(this,local_58);
    }
    this->Column = this->ColumnAtMapFlowStart;
    StringRef::StringRef(&local_68,"  ");
    output(this,local_68);
  }
  local_78 = this_local;
  local_70 = Key_local.Data;
  s.Length = (size_t)Key_local.Data;
  s.Data = (char *)this_local;
  output(this,s);
  StringRef::StringRef(&local_88,": ");
  output(this,local_88);
  return;
}

Assistant:

void Output::flowKey(StringRef Key) {
  if (StateStack.back() == inFlowMapOtherKey)
    output(", ");
  if (WrapColumn && Column > WrapColumn) {
    output("\n");
    for (int I = 0; I < ColumnAtMapFlowStart; ++I)
      output(" ");
    Column = ColumnAtMapFlowStart;
    output("  ");
  }
  output(Key);
  output(": ");
}